

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subprocess.h
# Opt level: O1

int subprocess::util::write_n(int fd,char *buf,size_t length)

{
  long lVar1;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar4 = 0;
  do {
    if (length < uVar4 || length - uVar4 == 0) break;
    uVar2 = write(fd,buf + uVar4,length - uVar4);
    lVar3 = 0;
    if ((uVar2 & 0xffffffff) != 0xffffffff) {
      lVar3 = (long)(int)uVar2;
    }
    uVar4 = uVar4 + lVar3;
  } while ((uVar2 & 0xffffffff) != 0xffffffff);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (int)*(long *)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

static inline
  int write_n(int fd, const char* buf, size_t length)
  {
    size_t nwritten = 0;
    while (nwritten < length) {
      int written = write(fd, buf + nwritten, length - nwritten);
      if (written == -1) return -1;
      nwritten += written;
    }
    return nwritten;
  }